

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_alloc_and_init
                    (ma_audio_buffer_config *pConfig,ma_audio_buffer **ppAudioBuffer)

{
  ma_format mVar1;
  ma_uint32 mVar2;
  long lVar3;
  void *pvVar4;
  undefined8 *in_RSI;
  ma_format *in_RDI;
  ma_uint64 allocationSizeInBytes;
  ma_audio_buffer_config innerConfig;
  ma_audio_buffer *pAudioBuffer;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffff78;
  void *p;
  ma_audio_buffer *in_stack_ffffffffffffff90;
  ma_uint32 in_stack_ffffffffffffff98;
  ma_format in_stack_ffffffffffffff9c;
  ma_audio_buffer_config *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  ma_allocation_callbacks *in_stack_ffffffffffffffb0;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  ma_result local_c;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_c = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    if (in_RDI == (ma_format *)0x0) {
      local_c = MA_INVALID_ARGS;
    }
    else {
      memcpy(&stack0xffffffffffffff90,in_RDI,0x40);
      ma_allocation_callbacks_init_copy(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      p = *(void **)(in_RDI + 4);
      mVar1 = in_RDI[1];
      mVar2 = ma_get_bytes_per_sample(*in_RDI);
      lVar3 = (long)p * (ulong)(mVar2 * mVar1) + 0x97;
      pvVar4 = ma_malloc((size_t)in_stack_ffffffffffffff78,(ma_allocation_callbacks *)0x1ddbc1);
      if (pvVar4 == (void *)0x0) {
        local_c = MA_OUT_OF_MEMORY;
      }
      else {
        if (*(undefined8 *)(in_RDI + 6) == ma_format_unknown) {
          ma_silence_pcm_frames
                    (in_stack_ffffffffffffffa8,(ma_uint64)in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
        }
        else {
          ma_copy_pcm_frames(in_stack_ffffffffffffffa0,
                             (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (ma_uint64)in_stack_ffffffffffffff90,(ma_format)((ulong)lVar3 >> 0x20),
                             (ma_uint32)lVar3);
        }
        local_c = ma_audio_buffer_init_ex
                            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                             in_stack_ffffffffffffff90);
        if (local_c == MA_SUCCESS) {
          *in_RSI = pvVar4;
          local_c = MA_SUCCESS;
        }
        else {
          ma_free(p,in_stack_ffffffffffffff78);
        }
      }
    }
  }
  return local_c;
}

Assistant:

MA_API ma_result ma_audio_buffer_alloc_and_init(const ma_audio_buffer_config* pConfig, ma_audio_buffer** ppAudioBuffer)
{
    ma_result result;
    ma_audio_buffer* pAudioBuffer;
    ma_audio_buffer_config innerConfig; /* We'll be making some changes to the config, so need to make a copy. */
    ma_uint64 allocationSizeInBytes;

    if (ppAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    *ppAudioBuffer = NULL;  /* Safety. */

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    innerConfig = *pConfig;
    ma_allocation_callbacks_init_copy(&innerConfig.allocationCallbacks, &pConfig->allocationCallbacks);

    allocationSizeInBytes = sizeof(*pAudioBuffer) - sizeof(pAudioBuffer->_pExtraData) + (pConfig->sizeInFrames * ma_get_bytes_per_frame(pConfig->format, pConfig->channels));
    if (allocationSizeInBytes > MA_SIZE_MAX) {
        return MA_OUT_OF_MEMORY;    /* Too big. */
    }

    pAudioBuffer = (ma_audio_buffer*)ma_malloc((size_t)allocationSizeInBytes, &innerConfig.allocationCallbacks);  /* Safe cast to size_t. */
    if (pAudioBuffer == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    if (pConfig->pData != NULL) {
        ma_copy_pcm_frames(&pAudioBuffer->_pExtraData[0], pConfig->pData, pConfig->sizeInFrames, pConfig->format, pConfig->channels);
    } else {
        ma_silence_pcm_frames(&pAudioBuffer->_pExtraData[0], pConfig->sizeInFrames, pConfig->format, pConfig->channels);
    }

    innerConfig.pData = &pAudioBuffer->_pExtraData[0];

    result = ma_audio_buffer_init_ex(&innerConfig, MA_FALSE, pAudioBuffer);
    if (result != MA_SUCCESS) {
        ma_free(pAudioBuffer, &innerConfig.allocationCallbacks);
        return result;
    }

    *ppAudioBuffer = pAudioBuffer;

    return MA_SUCCESS;
}